

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  vector<quadraple,_std::allocator<quadraple>_> token;
  string source;
  FinalParser Parser;
  vector<quadraple,_std::allocator<quadraple>_> vStack_a8;
  vector<quadraple,_std::allocator<quadraple>_> local_90;
  string local_78;
  FinalParser local_58;
  
  ReadProgram_abi_cxx11_();
  if (local_78._M_string_length != 0) {
    Lexical(&vStack_a8,&local_78);
    LLGrammatical(&vStack_a8);
    std::vector<quadraple,_std::allocator<quadraple>_>::vector(&local_90,&vStack_a8);
    FinalParser::FinalParser(&local_58,&local_90);
    std::vector<quadraple,_std::allocator<quadraple>_>::~vector(&local_90);
    FinalParser::ProcessDecl(&local_58);
    FinalParser::PrintSymtable(&local_58);
    FinalParser::Start(&local_58);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Sym>_>_>
                 *)&local_58.table);
    std::vector<quadraple,_std::allocator<quadraple>_>::~vector(&local_58.token);
    std::vector<quadraple,_std::allocator<quadraple>_>::~vector(&vStack_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main() {
    string source(ReadProgram());//source code read from file
    if (source.empty()) {//empty file or failed to open file
        return 0;
    }
    //cout<<source<<endl;

    vector <quadraple> token=Lexical(source);
    LLGrammatical(token);
    //LRGrammatical(token);
    FinalParser Parser(token);
    Parser.ProcessDecl();
    Parser.PrintSymtable();
    Parser.Start();
    //Parser.PrintSymtable();
    return 0;
}